

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

int Extra_bddVarIsInCube(DdNode *bCube,int iVar)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  DdNode *pDVar5;
  
  piVar2 = (int *)((ulong)bCube & 0xfffffffffffffffe);
  iVar3 = *piVar2;
  while( true ) {
    if (iVar3 == 0x7fffffff) {
      return -1;
    }
    uVar1 = *(ulong *)(piVar2 + 6);
    uVar4 = (ulong)((uint)bCube & 1);
    pDVar5 = (DdNode *)(uVar4 ^ uVar1);
    bCube = (DdNode *)(uVar4 ^ *(ulong *)(piVar2 + 4));
    if (((((ulong)pDVar5 & 1) == 0) || (*(int *)(uVar1 & 0xfffffffffffffffe) != 0x7fffffff)) &&
       ((((ulong)bCube & 1) == 0 ||
        (*(int *)(*(ulong *)(piVar2 + 4) & 0xfffffffffffffffe) != 0x7fffffff)))) break;
    if (iVar3 == iVar) {
      if (((ulong)pDVar5 & 1) == 0) {
        return 0;
      }
      return (uint)(*(int *)(uVar1 & 0xfffffffffffffffe) == 0x7fffffff);
    }
    if ((((ulong)pDVar5 & 1) == 0) || (*(int *)(uVar1 & 0xfffffffffffffffe) != 0x7fffffff)) {
      bCube = pDVar5;
    }
    piVar2 = (int *)((ulong)bCube & 0xfffffffffffffffe);
    iVar3 = *piVar2;
  }
  __assert_fail("(Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) || (Cudd_IsComplement(bCube1) && Cudd_Regular(bCube1)->index == CUDD_CONST_INDEX)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddMisc.c"
                ,0x429,"int Extra_bddVarIsInCube(DdNode *, int)");
}

Assistant:

int Extra_bddVarIsInCube( DdNode * bCube, int iVar )
{
    DdNode * bCube0, * bCube1;
    while ( Cudd_Regular(bCube)->index != CUDD_CONST_INDEX )
    {
        bCube0 = Cudd_NotCond( cuddE(Cudd_Regular(bCube)), Cudd_IsComplement(bCube) );
        bCube1 = Cudd_NotCond( cuddT(Cudd_Regular(bCube)), Cudd_IsComplement(bCube) );
        // make sure it is a cube
        assert( (Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) || // bCube0 == 0
                (Cudd_IsComplement(bCube1) && Cudd_Regular(bCube1)->index == CUDD_CONST_INDEX) ); // bCube1 == 0
        // quit if it is the last one
        if ( Cudd_Regular(bCube)->index == iVar )
            return (int)(Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX);
        // get the next cube
        if ( (Cudd_IsComplement(bCube0) && Cudd_Regular(bCube0)->index == CUDD_CONST_INDEX) )
            bCube = bCube1;
        else
            bCube = bCube0;
    }
    return -1;
}